

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadTest::CreateImageFromTexture::exec(CreateImageFromTexture *this,Thread *t)

{
  _func_int **pp_Var1;
  long lVar2;
  deUint32 dVar3;
  Thread *pTVar4;
  MessageBuilder *pMVar5;
  EGLImageKHR pvVar6;
  EGLint attribList [3];
  undefined8 local_1c0;
  undefined4 local_1b8;
  undefined1 local_1b0 [400];
  
  pTVar4 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (pTVar4 != (Thread *)0x0) {
    local_1b8 = 0x3038;
    local_1c0 = 0x30bc;
    local_1b0._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 0x18),"Begin -- glBindTexture(GL_TEXTURE_2D, ");
    pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,&((this->m_texture).m_ptr)->texture);
    std::operator<<((ostream *)&pMVar5->field_0x18,")");
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0xb8))
              (0xde1,((this->m_texture).m_ptr)->texture);
    dVar3 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar3,"bindTexture(GL_TEXTURE_2D, m_texture->texture)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x777);
    local_1b0._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 0x18),"End -- glBindTexture()");
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    local_1b0._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 0x18),
                    "Begin -- glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR)");
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x1360))(0xde1,0x2801,0x2601);
    dVar3 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar3,"texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x77c);
    local_1b0._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 0x18),"End -- glTexParameteri()");
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    local_1b0._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 0x18),
                    "Begin -- glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR)");
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x1360))(0xde1,0x2800,0x2601);
    dVar3 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar3,"texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x780);
    local_1b0._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 0x18),"End -- glTexParameteri()");
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    local_1b0._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 0x18),
                    "Begin -- glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE)");
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x1360))(0xde1,0x2803,0x812f);
    dVar3 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar3,"texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x784);
    local_1b0._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 0x18),"End -- glTexParameteri()");
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    local_1b0._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 0x18),
                    "Begin -- glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE)");
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x1360))(0xde1,0x2802,0x812f);
    dVar3 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar3,"texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x788);
    local_1b0._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 0x18),"End -- glTexParameteri()");
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    local_1b0._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 0x18),"Begin -- eglCreateImageKHR(");
    pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,
                        (void **)(*(long *)&pTVar4[1].m_random.m_rnd + 0x48));
    std::operator<<((ostream *)&pMVar5->field_0x18,", ");
    pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<
                       (pMVar5,(void **)(*(long *)&pTVar4[1].m_random.m_rnd + 0x50));
    std::operator<<((ostream *)&pMVar5->field_0x18,", EGL_GL_TEXTURE_2D_KHR, ");
    pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,&((this->m_texture).m_ptr)->texture)
    ;
    std::operator<<((ostream *)&pMVar5->field_0x18,", { EGL_GL_TEXTURE_LEVEL_KHR, 0, EGL_NONE })");
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    pp_Var1 = pTVar4[1].super_Thread._vptr_Thread;
    lVar2 = *(long *)&pTVar4[1].m_random.m_rnd;
    pvVar6 = (EGLImageKHR)
             (**(code **)(*pp_Var1 + 0x40))
                       (pp_Var1,*(undefined8 *)(lVar2 + 0x48),*(undefined8 *)(lVar2 + 0x50),0x30b1,
                        ((this->m_texture).m_ptr)->texture,&local_1c0);
    ((this->m_image).m_ptr)->image = pvVar6;
    dVar3 = (**(code **)(*pTVar4[1].super_Thread._vptr_Thread + 0xf8))();
    eglu::checkError(dVar3,"eglCreateImageKHR()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                     ,0x78d);
    local_1b0._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 0x18),"End -- ");
    pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,&((this->m_image).m_ptr)->image);
    std::operator<<((ostream *)&pMVar5->field_0x18," = eglCreateImageKHR()");
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    local_1b0._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 0x18),"Begin -- glBindTexture(GL_TEXTURE_2D, 0)");
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0xb8))(0xde1,0);
    dVar3 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar3,"bindTexture(GL_TEXTURE_2D, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x791);
    local_1b0._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 0x18),"End -- glBindTexture()");
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void CreateImageFromTexture::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	EGLint attribList[] = {
		EGL_GL_TEXTURE_LEVEL_KHR, 0,
		EGL_NONE
	};

	thread.newMessage() << "Begin -- glBindTexture(GL_TEXTURE_2D, " << m_texture->texture << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bindTexture(GL_TEXTURE_2D, m_texture->texture));
	thread.newMessage() << "End -- glBindTexture()" << tcu::ThreadUtil::Message::End;

	// Make texture image complete...
	thread.newMessage() << "Begin -- glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR));
	thread.newMessage() << "End -- glTexParameteri()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR));
	thread.newMessage() << "End -- glTexParameteri()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE));
	thread.newMessage() << "End -- glTexParameteri()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE));
	thread.newMessage() << "End -- glTexParameteri()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- eglCreateImageKHR(" << thread.runtimeContext->display << ", " << thread.runtimeContext->context << ", EGL_GL_TEXTURE_2D_KHR, " << m_texture->texture << ", { EGL_GL_TEXTURE_LEVEL_KHR, 0, EGL_NONE })" << tcu::ThreadUtil::Message::End;
	m_image->image = thread.egl.createImageKHR(thread.runtimeContext->display, thread.runtimeContext->context, EGL_GL_TEXTURE_2D_KHR, (EGLClientBuffer)(deUintptr)m_texture->texture, attribList);
	EGLU_CHECK_MSG(thread.egl, "eglCreateImageKHR()");
	thread.newMessage() << "End -- " << m_image->image << " = eglCreateImageKHR()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glBindTexture(GL_TEXTURE_2D, 0)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bindTexture(GL_TEXTURE_2D, 0));
	thread.newMessage() << "End -- glBindTexture()" << tcu::ThreadUtil::Message::End;
}